

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

char * strip_absolute_path(bsdtar *bsdtar,char *p)

{
  char cVar1;
  long lVar2;
  byte *pbVar3;
  char *pcVar4;
  byte *pbVar5;
  bool bVar6;
  
  if (((((*p == '\\') || (*p == '/')) && ((p[1] == '\\' || (p[1] == '/')))) &&
      ((cVar1 = p[2], cVar1 == '?' || (cVar1 == '.')))) && ((p[3] == '\\' || (p[3] == '/')))) {
    lVar2 = 4;
    if ((((cVar1 == '?') && ((byte)(p[4] | 0x20U) == 0x75)) && ((byte)(p[5] | 0x20U) == 0x6e)) &&
       ((byte)(p[6] | 0x20U) == 99)) {
      lVar2 = 8;
      if (p[7] != '/') {
        lVar2 = (ulong)(p[7] == '\\') * 4 + 4;
      }
    }
    p = p + lVar2;
    if (bsdtar->warned_lead_slash == '\0') {
      lafe_warnc(0,"Removing leading drive letter from member names");
      bsdtar->warned_lead_slash = '\x01';
    }
  }
  pcVar4 = &bsdtar->warned_lead_slash;
LAB_0010e83f:
  pbVar5 = (byte *)p;
  if (0x19 < (byte)((*p & 0xdfU) + 0xbf)) goto LAB_0010e86f;
  if (((byte *)p)[1] != 0x3a) goto LAB_0010e86f;
  pbVar3 = (byte *)p + 2;
  pbVar5 = pbVar3;
  if (*pcVar4 != '\0') goto LAB_0010e86f;
  lafe_warnc(0,"Removing leading drive letter from member names");
  do {
    *pcVar4 = '\x01';
    pbVar5 = pbVar3;
LAB_0010e86f:
    do {
      if ((*pbVar5 != 0x5c) && (*pbVar5 != 0x2f)) {
        bVar6 = (byte *)p == pbVar5;
        p = (char *)pbVar5;
        if (bVar6) {
          return (char *)pbVar5;
        }
        goto LAB_0010e83f;
      }
      if (pbVar5[1] == 0x2e) {
        if (pbVar5[2] == 0x2e) {
          pbVar3 = pbVar5 + 3;
          if ((pbVar5[3] != 0x2f) && (pbVar5[3] != 0x5c)) goto code_r0x0010e8a6;
        }
        else {
code_r0x0010e8a6:
          pbVar3 = pbVar5 + 2;
          if ((pbVar5[2] != 0x2f) && (pbVar5[2] != 0x5c)) goto LAB_0010e8b8;
        }
      }
      else {
LAB_0010e8b8:
        pbVar3 = pbVar5 + 1;
      }
      pbVar5 = pbVar3;
    } while (*pcVar4 != '\0');
    lafe_warnc(0,"Removing leading \'%c\' from member names",(ulong)(uint)(int)*p);
  } while( true );
}

Assistant:

static const char*
strip_absolute_path(struct bsdtar *bsdtar, const char *p)
{
	const char *rp;

	/* Remove leading "//./" or "//?/" or "//?/UNC/"
	 * (absolute path prefixes used by Windows API) */
	if ((p[0] == '/' || p[0] == '\\') &&
	    (p[1] == '/' || p[1] == '\\') &&
	    (p[2] == '.' || p[2] == '?') &&
	    (p[3] == '/' || p[3] == '\\'))
	{
		if (p[2] == '?' &&
		    (p[4] == 'U' || p[4] == 'u') &&
		    (p[5] == 'N' || p[5] == 'n') &&
		    (p[6] == 'C' || p[6] == 'c') &&
		    (p[7] == '/' || p[7] == '\\'))
			p += 8;
		else
			p += 4;
		warn_strip_drive_letter(bsdtar);
	}

	/* Remove multiple leading slashes and Windows drive letters. */
	do {
		rp = p;
		if (((p[0] >= 'a' && p[0] <= 'z') ||
		     (p[0] >= 'A' && p[0] <= 'Z')) &&
		    p[1] == ':') {
			p += 2;
			warn_strip_drive_letter(bsdtar);
		}

		/* Remove leading "/../", "/./", "//", etc. */
		while (p[0] == '/' || p[0] == '\\') {
			if (p[1] == '.' &&
			    p[2] == '.' &&
			    (p[3] == '/' || p[3] == '\\')) {
				p += 3; /* Remove "/..", leave "/" for next pass. */
			} else if (p[1] == '.' &&
				   (p[2] == '/' || p[2] == '\\')) {
				p += 2; /* Remove "/.", leave "/" for next pass. */
			} else
				p += 1; /* Remove "/". */
			warn_strip_leading_char(bsdtar, rp);
		}
	} while (rp != p);

	return (p);
}